

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O0

void p2sc_option_ext(int marg,int *argc,char ***argv,char *appname,char *context,char *summary,
                    GOptionEntry *entries)

{
  char *filename;
  undefined8 uVar1;
  long *in_RDX;
  int *in_RSI;
  int in_EDI;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_stack_00000008;
  char *help;
  GOptionContext *ctxt;
  GOptionEntry rentry [2];
  GError *err;
  gchar *base_file;
  gchar *base_prog;
  gchar *runid;
  gboolean ret;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 uVar2;
  char *in_stack_ffffffffffffff38;
  char *appname_00;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auStack_88 [16];
  undefined4 local_78;
  long local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  int local_34;
  undefined8 local_30;
  undefined8 local_28;
  long *local_18;
  int *local_10;
  int local_4;
  
  uVar2 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  local_40 = 0;
  local_50 = 0;
  local_58 = 0;
  appname_00 = "run-id";
  uVar3 = CONCAT31((int3)((uint)in_stack_ffffffffffffff50 >> 8),0x72);
  uVar4 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  memset(auStack_88,0,0x30);
  local_78 = 0;
  filename = (char *)g_option_context_new(local_28);
  g_option_context_set_summary(filename,local_30);
  g_option_context_add_main_entries(filename,&stack0xffffffffffffff48,0);
  if (in_stack_00000008 != 0) {
    g_option_context_add_main_entries(filename,in_stack_00000008,0);
  }
  local_34 = g_option_context_parse(filename,local_10,local_18,&local_58);
  local_48 = g_path_get_basename(*(undefined8 *)*local_18);
  if (*local_10 == 2) {
    local_50 = g_path_get_basename(*(undefined8 *)(*local_18 + 8));
  }
  p2sc_init((char *)CONCAT44(uVar4,uVar3),appname_00,filename,in_stack_ffffffffffffff38);
  if ((local_34 != 0) && (local_58 == 0)) {
    if ((0 < local_4) && (*local_10 + -1 < local_4)) {
      uVar1 = g_option_context_get_help(filename,1,0);
      printf("%s",uVar1);
      g_free(uVar1);
      _p2sc_msg("p2sc_option_ext",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
                ,0x90,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",4000,
                "At least %d argument(s) mandatory",CONCAT44(uVar2,local_4));
      exit(1);
    }
    g_free(local_50);
    g_free(local_48);
    g_free(local_40);
    g_option_context_free(filename);
    return;
  }
  if ((local_58 != 0) && (*(long *)(local_58 + 8) != 0)) {
    _p2sc_msg("p2sc_option_ext",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
              ,0x86,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",4000,
              "Option parsing failed: %s",*(undefined8 *)(local_58 + 8));
    exit(1);
  }
  _p2sc_msg("p2sc_option_ext",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
            ,0x89,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",4000,
            "Option parsing failed: unknown reason");
  exit(1);
}

Assistant:

void p2sc_option_ext(int marg, int *argc, char ***argv, const char *appname,
                     const char *context, const char *summary, const GOptionEntry *entries) {
    gboolean ret;
    gchar *runid = NULL;
    gchar *base_prog, *base_file = NULL;
    GError *err = NULL;
    GOptionEntry rentry[] = {
        { "run-id", 'r', 0, G_OPTION_ARG_STRING, &runid, "P2SC runID", "runID" },
        { NULL, 0, 0, G_OPTION_ARG_NONE, NULL, NULL, NULL }
    };
    GOptionContext *ctxt;

    ctxt = g_option_context_new(context);
    g_option_context_set_summary(ctxt, summary);
    g_option_context_add_main_entries(ctxt, rentry, NULL);
    if (entries)
        g_option_context_add_main_entries(ctxt, entries, NULL);

    ret = g_option_context_parse(ctxt, argc, argv, &err);

    base_prog = g_path_get_basename((*argv)[0]);
    if (*argc == 2)
        base_file = g_path_get_basename((*argv)[1]);

    p2sc_init(base_prog, appname, base_file, runid);

    if (!ret || err) {
        if (err && err->message) {
            P2SC_Msg(LVL_FATAL, "Option parsing failed: %s", err->message);
            g_error_free(err);
        } else
            P2SC_Msg(LVL_FATAL, "Option parsing failed: unknown reason");
    }
    if (marg > 0 && (*argc - 1) < marg) {
        char *help = g_option_context_get_help(ctxt, TRUE, NULL);
        printf("%s", help);
        g_free(help);

        P2SC_Msg(LVL_FATAL, "At least %d argument(s) mandatory", marg);
    }

    g_free(base_file);
    g_free(base_prog);
    g_free(runid);
    g_option_context_free(ctxt);
}